

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

uint16_t __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadHeader(OgreBinarySerializer *this,bool readLen)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint16_t id;
  bool readLen_local;
  OgreBinarySerializer *this_local;
  
  uVar1 = Read<unsigned_short>(this);
  if (readLen) {
    uVar2 = Read<unsigned_int>(this);
    this->m_currentLen = uVar2;
  }
  return uVar1;
}

Assistant:

uint16_t OgreBinarySerializer::ReadHeader(bool readLen)
{
    uint16_t id = Read<uint16_t>();
    if (readLen)
        m_currentLen = Read<uint32_t>();

#if (OGRE_BINARY_SERIALIZER_DEBUG == 1)
    if (id != HEADER_CHUNK_ID)
    {
        ASSIMP_LOG_DEBUG(Formatter::format() << (assetMode == AM_Mesh
            ? MeshHeaderToString(static_cast<MeshChunkId>(id)) : SkeletonHeaderToString(static_cast<SkeletonChunkId>(id))));
    }
#endif

    return id;
}